

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5UnicodeCreate(void *pUnused,char **azArg,int nArg,Fts5Tokenizer **ppOut)

{
  char cVar1;
  byte *z;
  int iVar2;
  uint uVar3;
  Unicode61Tokenizer *p;
  char *pcVar4;
  char *zCat;
  u16 *puVar5;
  uint uVar6;
  long lVar7;
  
  uVar3 = 1;
  if ((nArg & 1U) == 0) {
    iVar2 = sqlite3_initialize();
    if (iVar2 == 0) {
      p = (Unicode61Tokenizer *)sqlite3Malloc(0xc0);
    }
    else {
      p = (Unicode61Tokenizer *)0x0;
    }
    if (p == (Unicode61Tokenizer *)0x0) {
      uVar3 = 7;
    }
    else {
      memset(p,0,0xc0);
      p->nFold = 0x40;
      p->eRemoveDiacritic = 1;
      iVar2 = sqlite3_initialize();
      if (iVar2 == 0) {
        pcVar4 = (char *)sqlite3Malloc(0x40);
      }
      else {
        pcVar4 = (char *)0x0;
      }
      p->aFold = pcVar4;
      uVar3 = 7;
      if (pcVar4 != (char *)0x0) {
        uVar3 = 0;
      }
      zCat = "L* N* Co";
      if (0 < nArg && pcVar4 != (char *)0x0) {
        lVar7 = 1;
        do {
          if ((azArg[lVar7 + -1] != (char *)0x0) &&
             (iVar2 = sqlite3StrICmp(azArg[lVar7 + -1],"categories"), iVar2 == 0)) {
            zCat = azArg[lVar7];
          }
        } while ((pcVar4 != (char *)0x0) &&
                (iVar2 = (int)lVar7, lVar7 = lVar7 + 2, iVar2 + 1 < nArg));
      }
      if (pcVar4 != (char *)0x0) {
        if (*zCat != '\0') {
          do {
            while (cVar1 = *zCat, cVar1 == '\0') {
LAB_001b047b:
              while( true ) {
                cVar1 = *zCat;
                if (cVar1 == '\0') goto LAB_001b0491;
                if ((cVar1 == '\t') || (cVar1 == ' ')) break;
                zCat = zCat + 1;
              }
            }
            if ((cVar1 != ' ') && (cVar1 != '\t')) {
              iVar2 = sqlite3Fts5UnicodeCatParse(zCat,p->aCategory);
              if (iVar2 == 0) goto LAB_001b047b;
              uVar3 = 1;
              goto LAB_001b04f0;
            }
            zCat = zCat + 1;
          } while( true );
        }
LAB_001b0491:
        uVar3 = 0;
        puVar5 = aFts5UnicodeData;
        do {
          uVar6 = (*puVar5 >> 5) + uVar3;
          if (0x7f < (int)uVar6) {
            uVar6 = 0x80;
          }
          if ((int)uVar3 < (int)uVar6) {
            memset(p->aTokenChar + (int)uVar3,(uint)p->aCategory[*puVar5 & 0x1f],
                   (ulong)(~uVar3 + uVar6) + 1);
            uVar3 = uVar6;
          }
          puVar5 = puVar5 + 1;
        } while ((int)uVar3 < 0x80);
        uVar3 = 0;
      }
LAB_001b04f0:
      if (0 < nArg && uVar3 == 0) {
        lVar7 = 1;
        do {
          pcVar4 = azArg[lVar7 + -1];
          uVar3 = 1;
          if (pcVar4 != (char *)0x0) {
            z = (byte *)azArg[lVar7];
            iVar2 = sqlite3StrICmp(pcVar4,"remove_diacritics");
            if (iVar2 == 0) {
              uVar3 = 1;
              if (((byte)(*z - 0x30) < 3) && (z[1] == 0)) {
                p->eRemoveDiacritic = *z - 0x30;
                uVar3 = 0;
              }
            }
            else {
              uVar3 = 1;
              if (pcVar4 != (char *)0x0) {
                iVar2 = sqlite3StrICmp(pcVar4,"tokenchars");
                if (iVar2 == 0) {
                  iVar2 = 1;
LAB_001b05e0:
                  uVar3 = fts5UnicodeAddExceptions(p,(char *)z,iVar2);
                }
                else {
                  uVar3 = 1;
                  if (pcVar4 != (char *)0x0) {
                    iVar2 = sqlite3StrICmp(pcVar4,"separators");
                    if (iVar2 == 0) {
                      iVar2 = 0;
                      goto LAB_001b05e0;
                    }
                    uVar3 = 1;
                    if (pcVar4 != (char *)0x0) {
                      iVar2 = sqlite3StrICmp(pcVar4,"categories");
                      uVar3 = (uint)(iVar2 != 0);
                    }
                  }
                }
              }
            }
          }
        } while ((uVar3 == 0) && (iVar2 = (int)lVar7, lVar7 = lVar7 + 2, iVar2 + 1 < nArg));
      }
    }
    if (uVar3 != 0) {
      fts5UnicodeDelete((Fts5Tokenizer *)p);
      p = (Unicode61Tokenizer *)0x0;
    }
    *ppOut = (Fts5Tokenizer *)p;
  }
  return uVar3;
}

Assistant:

static int fts5UnicodeCreate(
  void *pUnused, 
  const char **azArg, int nArg,
  Fts5Tokenizer **ppOut
){
  int rc = SQLITE_OK;             /* Return code */
  Unicode61Tokenizer *p = 0;      /* New tokenizer object */ 

  UNUSED_PARAM(pUnused);

  if( nArg%2 ){
    rc = SQLITE_ERROR;
  }else{
    p = (Unicode61Tokenizer*)sqlite3_malloc(sizeof(Unicode61Tokenizer));
    if( p ){
      const char *zCat = "L* N* Co";
      int i;
      memset(p, 0, sizeof(Unicode61Tokenizer));

      p->eRemoveDiacritic = FTS5_REMOVE_DIACRITICS_SIMPLE;
      p->nFold = 64;
      p->aFold = sqlite3_malloc64(p->nFold * sizeof(char));
      if( p->aFold==0 ){
        rc = SQLITE_NOMEM;
      }

      /* Search for a "categories" argument */
      for(i=0; rc==SQLITE_OK && i<nArg; i+=2){
        if( 0==sqlite3_stricmp(azArg[i], "categories") ){
          zCat = azArg[i+1];
        }
      }

      if( rc==SQLITE_OK ){
        rc = unicodeSetCategories(p, zCat);
      }

      for(i=0; rc==SQLITE_OK && i<nArg; i+=2){
        const char *zArg = azArg[i+1];
        if( 0==sqlite3_stricmp(azArg[i], "remove_diacritics") ){
          if( (zArg[0]!='0' && zArg[0]!='1' && zArg[0]!='2') || zArg[1] ){
            rc = SQLITE_ERROR;
          }else{
            p->eRemoveDiacritic = (zArg[0] - '0');
            assert( p->eRemoveDiacritic==FTS5_REMOVE_DIACRITICS_NONE
                 || p->eRemoveDiacritic==FTS5_REMOVE_DIACRITICS_SIMPLE
                 || p->eRemoveDiacritic==FTS5_REMOVE_DIACRITICS_COMPLEX
            );
          }
        }else
        if( 0==sqlite3_stricmp(azArg[i], "tokenchars") ){
          rc = fts5UnicodeAddExceptions(p, zArg, 1);
        }else
        if( 0==sqlite3_stricmp(azArg[i], "separators") ){
          rc = fts5UnicodeAddExceptions(p, zArg, 0);
        }else
        if( 0==sqlite3_stricmp(azArg[i], "categories") ){
          /* no-op */
        }else{
          rc = SQLITE_ERROR;
        }
      }

    }else{
      rc = SQLITE_NOMEM;
    }
    if( rc!=SQLITE_OK ){
      fts5UnicodeDelete((Fts5Tokenizer*)p);
      p = 0;
    }
    *ppOut = (Fts5Tokenizer*)p;
  }
  return rc;
}